

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_GetAvailableFrames
                  (PaAlsaStream *self,int queryCapture,int queryPlayback,unsigned_long *available,
                  int *xrunOccurred)

{
  PaError PVar1;
  char *format;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  ulong local_38;
  unsigned_long local_30;
  
  *xrunOccurred = 0;
  if (queryCapture == 0) {
    if (queryPlayback != 0) goto LAB_00112003;
LAB_00112040:
    *available = local_38;
    PVar1 = 0;
  }
  else {
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                           ((PaAlsaStreamComponent *)(self->capture).pcm,&local_30,xrunOccurred);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3708\n"
      ;
    }
    else {
      if (*xrunOccurred != 0) {
        return 0;
      }
      if (queryPlayback == 0) {
        *available = local_30;
        return 0;
      }
LAB_00112003:
      paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                             ((PaAlsaStreamComponent *)(self->playback).pcm,&local_38,xrunOccurred);
      if (-1 < paUtilErr_) {
        if (*xrunOccurred != 0) {
          return 0;
        }
        if (queryCapture != 0) {
          if (local_30 < local_38) {
            local_38 = local_30;
          }
          *available = local_38;
          return 0;
        }
        goto LAB_00112040;
      }
      format = 
      "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3717\n"
      ;
    }
    PaUtil_DebugPrint(format);
    PVar1 = paUtilErr_;
  }
  return PVar1;
}

Assistant:

static PaError PaAlsaStream_GetAvailableFrames( PaAlsaStream *self, int queryCapture, int queryPlayback, unsigned long
        *available, int *xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames, playbackFrames;
    *xrunOccurred = 0;

    assert( queryCapture || queryPlayback );

    if( queryCapture )
    {
        assert( self->capture.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }
    if( queryPlayback )
    {
        assert( self->playback.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }

    if( queryCapture && queryPlayback )
    {
        *available = PA_MIN( captureFrames, playbackFrames );
        /*PA_DEBUG(("capture: %lu, playback: %lu, combined: %lu\n", captureFrames, playbackFrames, *available));*/
    }
    else if( queryCapture )
    {
        *available = captureFrames;
    }
    else
    {
        *available = playbackFrames;
    }

end:
error:
    return result;
}